

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O2

void __thiscall Node::Dump(Node *this,char *prefix)

{
  char *pcVar1;
  char *pcVar2;
  pointer ppEVar3;
  
  pcVar2 = " (:missing)";
  if (this->exists_ == ExistenceStatusExists) {
    pcVar2 = "";
  }
  pcVar1 = " clean";
  if (this->dirty_ != false) {
    pcVar1 = " dirty";
  }
  printf("%s <%s 0x%p> mtime: %ld%s, (:%s), ",prefix,(this->path_)._M_dataplus._M_p,this,
         this->mtime_,pcVar2,pcVar1);
  if (this->in_edge_ == (Edge *)0x0) {
    puts("no in-edge");
  }
  else {
    Edge::Dump(this->in_edge_,"in-edge: ");
  }
  puts(" out edges:");
  for (ppEVar3 = (this->out_edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      (ppEVar3 !=
       (this->out_edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
       super__Vector_impl_data._M_finish && (*ppEVar3 != (Edge *)0x0)); ppEVar3 = ppEVar3 + 1) {
    Edge::Dump(*ppEVar3," +- ");
  }
  if ((this->validation_out_edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->validation_out_edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    puts(" validation out edges:");
    for (ppEVar3 = (this->validation_out_edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        (ppEVar3 !=
         (this->validation_out_edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
         super__Vector_impl_data._M_finish && (*ppEVar3 != (Edge *)0x0)); ppEVar3 = ppEVar3 + 1) {
      Edge::Dump(*ppEVar3," +- ");
    }
  }
  return;
}

Assistant:

void Node::Dump(const char* prefix) const {
  printf("%s <%s 0x%p> mtime: %" PRId64 "%s, (:%s), ",
         prefix, path().c_str(), this,
         mtime(), exists() ? "" : " (:missing)",
         dirty() ? " dirty" : " clean");
  if (in_edge()) {
    in_edge()->Dump("in-edge: ");
  } else {
    printf("no in-edge\n");
  }
  printf(" out edges:\n");
  for (vector<Edge*>::const_iterator e = out_edges().begin();
       e != out_edges().end() && *e != NULL; ++e) {
    (*e)->Dump(" +- ");
  }
  if (!validation_out_edges().empty()) {
    printf(" validation out edges:\n");
    for (std::vector<Edge*>::const_iterator e = validation_out_edges().begin();
         e != validation_out_edges().end() && *e != NULL; ++e) {
      (*e)->Dump(" +- ");
    }
  }
}